

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O1

void fuzzBytes(BuilderContext *ctx)

{
  RandomGenerator *this;
  size_type sVar1;
  result_type_conflict rVar2;
  result_type_conflict rVar3;
  Buffer<unsigned_char> *this_00;
  ulong uVar4;
  int iVar5;
  int iVar6;
  string vpackBytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  BuilderContext *local_38;
  
  this = &ctx->randomGenerator;
  iVar6 = 10;
  local_38 = ctx;
  do {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&this->mt64);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&this->mt64);
    this_00 = arangodb::velocypack::Builder::bufferRef(&local_38->builder);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,this_00->_buffer,this_00->_buffer + this_00->_size);
    sVar1 = local_58._M_string_length;
    if (local_58._M_string_length == 0) {
      uVar4 = 0;
    }
    else {
      iVar5 = (int)rVar3 + (int)(rVar3 / 3) * -3;
      uVar4 = (ulong)(0x18 < local_58._M_string_length) << 3;
      if (iVar5 == 2) {
        rVar3 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar4 = rVar3 % (uVar4 | 1) + sVar1 + ~uVar4;
      }
      else if (iVar5 == 1) {
        rVar3 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar4 = rVar3 % sVar1;
      }
      else {
        rVar3 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar4 = rVar3 % (uVar4 | 1);
      }
    }
    iVar5 = (int)rVar2 + (int)(rVar2 / 3) * -3;
    if (iVar5 == 0) {
      if (local_58._M_string_length != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_58,uVar4,1);
        goto LAB_00105877;
      }
    }
    else {
      if (iVar5 == 1) {
        if (local_58._M_string_length == 0) goto LAB_001058bb;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        local_58._M_dataplus._M_p[uVar4] = (char)rVar2;
      }
      else {
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (&local_58,uVar4,1,(char)rVar2);
      }
LAB_00105877:
      this_00->_size = 0;
      if (this_00->_buffer != this_00->_local) {
        free(this_00->_buffer);
        this_00->_buffer = this_00->_local;
        this_00->_capacity = 0xc0;
      }
      *this_00->_buffer = '\0';
      arangodb::velocypack::Buffer<unsigned_char>::append<unsigned_char>
                (this_00,(uchar *)local_58._M_dataplus._M_p,local_58._M_string_length);
    }
LAB_001058bb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void fuzzBytes(BuilderContext& ctx) {
  using limits = KnownLimitValues;
  for (uint32_t i = 0; i < limits::numFuzzIterations; ++i) {
    FuzzActions fuzzAction = static_cast<FuzzActions>(
        ctx.randomGenerator.mt64() % FuzzActions::NUM_OPTIONS_ACTIONS);
    FuzzBytes fuzzByte = static_cast<FuzzBytes>(ctx.randomGenerator.mt64() %
                                                FuzzBytes::NUM_OPTIONS_BYTES);
    auto& builderBuffer = ctx.builder.bufferRef();
    std::string vpackBytes = builderBuffer.toString();
    size_t bytePos = getBytePos(ctx, fuzzByte, vpackBytes);
    switch (fuzzAction) {
      case REMOVE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes.erase(bytePos, 1);
        break;
      case REPLACE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes[bytePos] =
            generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator);
        break;
      case INSERT_BYTE:
        vpackBytes.insert(
            bytePos, 1,
            static_cast<std::string::value_type>(
                generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator)));
        break;
      default:
        VELOCYPACK_ASSERT(false);
    }
    builderBuffer.clear();
    builderBuffer.append(reinterpret_cast<uint8_t const*>(vpackBytes.data()),
                         vpackBytes.size());
  }
}